

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::GeometryShaderRenderTest::renderWithContext
          (GeometryShaderRenderTest *this,Context *ctx,ShaderProgram *program,Surface *dstSurface)

{
  uint uVar1;
  Surface *pSVar2;
  ShaderProgram *pSVar3;
  deUint32 dVar4;
  size_type sVar5;
  reference pvVar6;
  reference pvVar7;
  uint *puVar8;
  uint local_44;
  uint local_40;
  GLuint elementArrayBuf;
  GLuint vertexAttrBuf;
  GLuint vertexPosBuf;
  GLuint vaoId;
  GLint attrColLoc;
  GLint attrPosLoc;
  GLuint programId;
  Surface *dstSurface_local;
  ShaderProgram *program_local;
  Context *ctx_local;
  GeometryShaderRenderTest *this_local;
  
  _attrPosLoc = dstSurface;
  dstSurface_local = (Surface *)program;
  program_local = (ShaderProgram *)ctx;
  ctx_local = (Context *)this;
  attrColLoc = (*ctx->_vptr_Context[0x75])(ctx,program);
  vaoId = (*(program_local->super_VertexShader)._vptr_VertexShader[0x59])
                    (program_local,(ulong)(uint)attrColLoc,"a_position");
  vertexPosBuf = (*(program_local->super_VertexShader)._vptr_VertexShader[0x59])
                           (program_local,(ulong)(uint)attrColLoc,this->m_dataAttributeName);
  vertexAttrBuf = 0;
  elementArrayBuf = 0;
  local_40 = 0;
  local_44 = 0;
  (*(program_local->super_VertexShader)._vptr_VertexShader[0x4c])(program_local,1,&vertexAttrBuf);
  (*(program_local->super_VertexShader)._vptr_VertexShader[0x4b])
            (program_local,(ulong)vertexAttrBuf);
  if (vaoId != 0xffffffff) {
    (*(program_local->super_VertexShader)._vptr_VertexShader[0x26])
              (program_local,1,&elementArrayBuf);
    (*(program_local->super_VertexShader)._vptr_VertexShader[0x25])
              (program_local,0x8892,(ulong)elementArrayBuf);
    pSVar3 = program_local;
    sVar5 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                      (&this->m_vertexPosData);
    pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       (&this->m_vertexPosData,0);
    (*(pSVar3->super_VertexShader)._vptr_VertexShader[0x28])(pSVar3,0x8892,sVar5 << 4,pvVar6,0x88e4)
    ;
    (*(program_local->super_VertexShader)._vptr_VertexShader[0x4e])
              (program_local,(ulong)vaoId,4,0x1406,0,0,0);
    (*(program_local->super_VertexShader)._vptr_VertexShader[0x50])(program_local,(ulong)vaoId);
  }
  if (vertexPosBuf != 0xffffffff) {
    (*(program_local->super_VertexShader)._vptr_VertexShader[0x26])(program_local,1,&local_40);
    (*(program_local->super_VertexShader)._vptr_VertexShader[0x25])
              (program_local,0x8892,(ulong)local_40);
    pSVar3 = program_local;
    sVar5 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                      (&this->m_vertexAttrData);
    pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       (&this->m_vertexAttrData,0);
    (*(pSVar3->super_VertexShader)._vptr_VertexShader[0x28])(pSVar3,0x8892,sVar5 << 4,pvVar6,0x88e4)
    ;
    (*(program_local->super_VertexShader)._vptr_VertexShader[0x4e])
              (program_local,(ulong)vertexPosBuf,4,0x1406,0,0,0);
    (*(program_local->super_VertexShader)._vptr_VertexShader[0x50])
              (program_local,(ulong)vertexPosBuf);
    if (this->m_vertexAttrDivisor != 0) {
      (*(program_local->super_VertexShader)._vptr_VertexShader[0x52])
                (program_local,(ulong)vertexPosBuf,(ulong)(uint)this->m_vertexAttrDivisor);
    }
  }
  if ((this->m_flags & 2U) != 0) {
    (*(program_local->super_VertexShader)._vptr_VertexShader[0x26])(program_local,1,&local_44);
    (*(program_local->super_VertexShader)._vptr_VertexShader[0x25])
              (program_local,0x8893,(ulong)local_44);
    pSVar3 = program_local;
    sVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&this->m_indices);
    pvVar7 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                       (&this->m_indices,0);
    (*(pSVar3->super_VertexShader)._vptr_VertexShader[0x28])(pSVar3,0x8893,sVar5 << 1,pvVar7,0x88e4)
    ;
  }
  (*(program_local->super_VertexShader)._vptr_VertexShader[0x2a])(0,0,0,0x3f800000);
  (*(program_local->super_VertexShader)._vptr_VertexShader[0x2d])(program_local,0x4000);
  pSVar3 = program_local;
  puVar8 = (uint *)tcu::Vector<int,_2>::x(&this->m_viewportSize);
  uVar1 = *puVar8;
  puVar8 = (uint *)tcu::Vector<int,_2>::y(&this->m_viewportSize);
  (*(pSVar3->super_VertexShader)._vptr_VertexShader[5])(pSVar3,0,0,(ulong)uVar1,(ulong)*puVar8);
  dVar4 = (*(program_local->super_VertexShader)._vptr_VertexShader[0x79])();
  glu::checkError(dVar4,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x82f);
  (*(program_local->super_VertexShader)._vptr_VertexShader[0x76])
            (program_local,(ulong)(uint)attrColLoc);
  dVar4 = (*(program_local->super_VertexShader)._vptr_VertexShader[0x79])();
  glu::checkError(dVar4,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x832);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])
            (this,program_local,(ulong)(uint)attrColLoc);
  dVar4 = (*(program_local->super_VertexShader)._vptr_VertexShader[0x79])();
  glu::checkError(dVar4,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x835);
  if ((this->m_flags & 4U) != 0) {
    (*(program_local->super_VertexShader)._vptr_VertexShader[0x33])(program_local,0x8d69);
    dVar4 = (*(program_local->super_VertexShader)._vptr_VertexShader[0x79])();
    glu::checkError(dVar4,(char *)0x0,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                    ,0x83a);
  }
  if ((this->m_flags & 2U) == 0) {
    if ((this->m_flags & 1U) == 0) {
      (*(program_local->super_VertexShader)._vptr_VertexShader[0x68])
                (program_local,(ulong)this->m_inputPrimitives,0,(ulong)(uint)this->m_numDrawVertices
                );
    }
    else {
      (*(program_local->super_VertexShader)._vptr_VertexShader[0x69])
                (program_local,(ulong)this->m_inputPrimitives,0,(ulong)(uint)this->m_numDrawVertices
                 ,(ulong)(uint)this->m_numDrawInstances);
    }
  }
  else {
    (*(program_local->super_VertexShader)._vptr_VertexShader[0x6a])
              (program_local,(ulong)this->m_inputPrimitives,(ulong)(uint)this->m_numDrawVertices,
               0x1403,0);
  }
  dVar4 = (*(program_local->super_VertexShader)._vptr_VertexShader[0x79])();
  glu::checkError(dVar4,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x844);
  if ((this->m_flags & 4U) != 0) {
    (*(program_local->super_VertexShader)._vptr_VertexShader[0x34])(program_local,0x8d69);
    dVar4 = (*(program_local->super_VertexShader)._vptr_VertexShader[0x79])();
    glu::checkError(dVar4,(char *)0x0,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                    ,0x849);
  }
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[8])
            (this,program_local,(ulong)(uint)attrColLoc);
  dVar4 = (*(program_local->super_VertexShader)._vptr_VertexShader[0x79])();
  glu::checkError(dVar4,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x84d);
  (*(program_local->super_VertexShader)._vptr_VertexShader[0x76])(program_local,0);
  if (vaoId != 0xffffffff) {
    (*(program_local->super_VertexShader)._vptr_VertexShader[0x51])(program_local,(ulong)vaoId);
  }
  if (vertexPosBuf != 0xffffffff) {
    (*(program_local->super_VertexShader)._vptr_VertexShader[0x51])
              (program_local,(ulong)vertexPosBuf);
  }
  if (elementArrayBuf != 0) {
    (*(program_local->super_VertexShader)._vptr_VertexShader[0x27])
              (program_local,1,&elementArrayBuf);
  }
  if (local_40 != 0) {
    (*(program_local->super_VertexShader)._vptr_VertexShader[0x27])(program_local,1,&local_40);
  }
  if (local_44 != 0) {
    (*(program_local->super_VertexShader)._vptr_VertexShader[0x27])(program_local,1,&local_44);
  }
  (*(program_local->super_VertexShader)._vptr_VertexShader[0x4d])(program_local,1,&vertexAttrBuf);
  dVar4 = (*(program_local->super_VertexShader)._vptr_VertexShader[0x79])();
  glu::checkError(dVar4,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x85f);
  (*(program_local->super_VertexShader)._vptr_VertexShader[0x7a])();
  pSVar3 = program_local;
  pSVar2 = _attrPosLoc;
  puVar8 = (uint *)tcu::Vector<int,_2>::x(&this->m_viewportSize);
  uVar1 = *puVar8;
  puVar8 = (uint *)tcu::Vector<int,_2>::y(&this->m_viewportSize);
  (*(pSVar3->super_VertexShader)._vptr_VertexShader[0x80])
            (pSVar3,pSVar2,0,0,(ulong)uVar1,(ulong)*puVar8);
  return;
}

Assistant:

void GeometryShaderRenderTest::renderWithContext (sglr::Context& ctx, sglr::ShaderProgram& program, tcu::Surface& dstSurface)
{
#define CHECK_GL_CTX_ERRORS() glu::checkError(ctx.getError(), DE_NULL, __FILE__, __LINE__)

	const GLuint	programId		= ctx.createProgram(&program);
	const GLint		attrPosLoc		= ctx.getAttribLocation(programId, "a_position");
	const GLint		attrColLoc		= ctx.getAttribLocation(programId, m_dataAttributeName);
	GLuint			vaoId			= 0;
	GLuint			vertexPosBuf	= 0;
	GLuint			vertexAttrBuf	= 0;
	GLuint			elementArrayBuf	= 0;

	ctx.genVertexArrays(1, &vaoId);
	ctx.bindVertexArray(vaoId);

	if (attrPosLoc != -1)
	{
		ctx.genBuffers(1, &vertexPosBuf);
		ctx.bindBuffer(GL_ARRAY_BUFFER, vertexPosBuf);
		ctx.bufferData(GL_ARRAY_BUFFER, m_vertexPosData.size() * sizeof(tcu::Vec4), &m_vertexPosData[0], GL_STATIC_DRAW);
		ctx.vertexAttribPointer(attrPosLoc, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
		ctx.enableVertexAttribArray(attrPosLoc);
	}

	if (attrColLoc != -1)
	{
		ctx.genBuffers(1, &vertexAttrBuf);
		ctx.bindBuffer(GL_ARRAY_BUFFER, vertexAttrBuf);
		ctx.bufferData(GL_ARRAY_BUFFER, m_vertexAttrData.size() * sizeof(tcu::Vec4), &m_vertexAttrData[0], GL_STATIC_DRAW);
		ctx.vertexAttribPointer(attrColLoc, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
		ctx.enableVertexAttribArray(attrColLoc);

		if (m_vertexAttrDivisor)
			ctx.vertexAttribDivisor(attrColLoc, m_vertexAttrDivisor);
	}

	if (m_flags & FLAG_USE_INDICES)
	{
		ctx.genBuffers(1, &elementArrayBuf);
		ctx.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, elementArrayBuf);
		ctx.bufferData(GL_ELEMENT_ARRAY_BUFFER, m_indices.size() * sizeof(deUint16), &m_indices[0], GL_STATIC_DRAW);
	}

	ctx.clearColor(0, 0, 0, 1);
	ctx.clear(GL_COLOR_BUFFER_BIT);

	ctx.viewport(0, 0, m_viewportSize.x(), m_viewportSize.y());
	CHECK_GL_CTX_ERRORS();

	ctx.useProgram(programId);
	CHECK_GL_CTX_ERRORS();

	preRender(ctx, programId);
	CHECK_GL_CTX_ERRORS();

	if (m_flags & FLAG_USE_RESTART_INDEX)
	{
		ctx.enable(GL_PRIMITIVE_RESTART_FIXED_INDEX);
		CHECK_GL_CTX_ERRORS();
	}

	if (m_flags & FLAG_USE_INDICES)
		ctx.drawElements(m_inputPrimitives, m_numDrawVertices, GL_UNSIGNED_SHORT, DE_NULL);
	else if (m_flags & FLAG_DRAW_INSTANCED)
		ctx.drawArraysInstanced(m_inputPrimitives, 0, m_numDrawVertices, m_numDrawInstances);
	else
		ctx.drawArrays(m_inputPrimitives, 0, m_numDrawVertices);

	CHECK_GL_CTX_ERRORS();

	if (m_flags & FLAG_USE_RESTART_INDEX)
	{
		ctx.disable(GL_PRIMITIVE_RESTART_FIXED_INDEX);
		CHECK_GL_CTX_ERRORS();
	}

	postRender(ctx, programId);
	CHECK_GL_CTX_ERRORS();

	ctx.useProgram(0);

	if (attrPosLoc != -1)
		ctx.disableVertexAttribArray(attrPosLoc);
	if (attrColLoc != -1)
		ctx.disableVertexAttribArray(attrColLoc);

	if (vertexPosBuf)
		ctx.deleteBuffers(1, &vertexPosBuf);
	if (vertexAttrBuf)
		ctx.deleteBuffers(1, &vertexAttrBuf);
	if (elementArrayBuf)
		ctx.deleteBuffers(1, &elementArrayBuf);

	ctx.deleteVertexArrays(1, &vaoId);

	CHECK_GL_CTX_ERRORS();

	ctx.finish();
	ctx.readPixels(dstSurface, 0, 0, m_viewportSize.x(), m_viewportSize.y());

#undef CHECK_GL_CTX_ERRORS
}